

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iec61131.l.cpp
# Opt level: O1

void __thiscall deci_FlexLexer::yyrestart(deci_FlexLexer *this,istream *input_file)

{
  int iVar1;
  undefined4 extraout_var;
  YY_BUFFER_STATE b;
  
  if ((this->yy_buffer_stack == (yy_buffer_state **)0x0) ||
     (this->yy_buffer_stack[this->yy_buffer_stack_top] == (yy_buffer_state *)0x0)) {
    yyensure_buffer_stack(this);
    iVar1 = (*(this->super_FlexLexer)._vptr_FlexLexer[4])(this,&this->yyin,0x4000);
    this->yy_buffer_stack[this->yy_buffer_stack_top] =
         (yy_buffer_state *)CONCAT44(extraout_var,iVar1);
  }
  if (this->yy_buffer_stack == (yy_buffer_state **)0x0) {
    b = (YY_BUFFER_STATE)0x0;
  }
  else {
    b = this->yy_buffer_stack[this->yy_buffer_stack_top];
  }
  yy_init_buffer(this,b,input_file);
  yy_load_buffer_state(this);
  return;
}

Assistant:

void yyFlexLexer::yyrestart( std::istream& input_file )
{
    
	if ( ! YY_CURRENT_BUFFER ){
        yyensure_buffer_stack ();
		YY_CURRENT_BUFFER_LVALUE =
            yy_create_buffer( yyin, YY_BUF_SIZE );
	}

	yy_init_buffer( YY_CURRENT_BUFFER, input_file );
	yy_load_buffer_state(  );
}